

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linear_Object_State_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Linear_Object_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Linear_Object_State_PDU *this)

{
  pointer pLVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  pointer pLVar3;
  KStringStream ss;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  Header7::GetAsString_abi_cxx11_(&local_290,(Header7 *)this);
  poVar2 = std::operator<<(local_1a0,(string *)&local_290);
  poVar2 = std::operator<<(poVar2,"-Linear Object State PDU-\n");
  Object_State_Header::GetAsString_abi_cxx11_(&local_1d0,&this->super_Object_State_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"Number Of Segments: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(ushort)(byte)(this->super_Object_State_Header).field_0x4b);
  poVar2 = std::operator<<(poVar2,"Requestor ID:\n");
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_210,&this->m_ReqID);
  UTILS::IndentString(&local_1f0,&local_210,Tabs,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Receiving ID:\n");
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_250,&this->m_RecvID);
  UTILS::IndentString(&local_230,&local_250,Tabs_00,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,"Object Type:  ");
  DATA_TYPE::ObjectType::GetAsString_abi_cxx11_(&local_270,&this->m_ObjTyp);
  std::operator<<(poVar2,(string *)&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_290);
  pLVar1 = (this->m_vSegments).
           super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pLVar3 = (this->m_vSegments).
                super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
                ._M_impl.super__Vector_impl_data._M_start; pLVar3 != pLVar1; pLVar3 = pLVar3 + 1) {
    (*(pLVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_290,pLVar3);
    std::operator<<(local_1a0,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

KString Linear_Object_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Linear Object State PDU-\n"
       << Object_State_Header::GetAsString()
       << "Number Of Segments: " << ( KUINT16 )m_ui8NumSegment
       << "Requestor ID:\n"  << IndentString( m_ReqID.GetAsString(), 1 )
       << "Receiving ID:\n"  << IndentString( m_RecvID.GetAsString(), 1 )
       << "Object Type:  "   << m_ObjTyp.GetAsString();

    vector<LinearSegmentParameter>::const_iterator citr = m_vSegments.begin();
    std::vector<LinearSegmentParameter>::const_iterator citrEnd = m_vSegments.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << citr->GetAsString();
    }

    return ss.str();
}